

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::OFFImporter::InternReadFile
          (OFFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float *pfVar1;
  byte bVar2;
  Assimp AVar3;
  char cVar4;
  bool bVar5;
  size_type end;
  aiScene *paVar6;
  int iVar7;
  undefined4 extraout_var;
  aiMesh **ppaVar8;
  aiMesh *paVar9;
  ulong *puVar10;
  aiVector3D *paVar11;
  aiVector3D *paVar12;
  aiColor4D *paVar13;
  Logger *pLVar14;
  aiNode *this_00;
  uint *puVar15;
  aiMaterial **ppaVar16;
  aiMaterial *this_01;
  long *plVar17;
  runtime_error *prVar18;
  byte bVar19;
  long *plVar20;
  aiFace *paVar21;
  ulong uVar22;
  ulong uVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  long **pplVar27;
  Assimp *pAVar28;
  char *car;
  int twosided;
  vector<char,_std::allocator<char>_> mBuffer2;
  aiColor4D clr;
  char line [4096];
  byte *local_10e8;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  ulong local_10d0;
  float local_10c4;
  aiMesh *local_10c0;
  IOStream *local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  aiVector3D **local_10a0;
  aiColor4D **local_1098;
  aiVector3D **local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  aiVector3D *local_1068;
  float *pfStack_1060;
  float *local_1058;
  aiScene *local_1050;
  ulong local_1048;
  ulong local_1040;
  long *local_1038;
  long local_1030;
  long local_1028;
  long lStack_1020;
  
  local_1038 = &local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1038,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1038);
  local_10b8 = (IOStream *)CONCAT44(extraout_var,iVar7);
  if (local_1038 != &local_1028) {
    operator_delete(local_1038,local_1028 + 1);
  }
  if (local_10b8 == (IOStream *)0x0) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1088,"Failed to open OFF file ",pFile);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_1088);
    local_1038 = (long *)*plVar17;
    plVar20 = plVar17 + 2;
    if (local_1038 == plVar20) {
      local_1028 = *plVar20;
      lStack_1020 = plVar17[3];
      local_1038 = &local_1028;
    }
    else {
      local_1028 = *plVar20;
    }
    local_1030 = plVar17[1];
    *plVar17 = (long)plVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::runtime_error::runtime_error(prVar18,(string *)&local_1038);
    *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1088._M_dataplus._M_p = (pointer)0x0;
  local_1088._M_string_length = 0;
  local_1088.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (local_10b8,(vector<char,_std::allocator<char>_> *)&local_1088,FORBID_EMPTY);
  end = local_1088._M_string_length;
  local_10e8 = (byte *)local_1088._M_dataplus._M_p;
  NextToken((char **)&local_10e8,(char *)local_1088._M_string_length);
  if (((local_10e8 < (byte *)(end + -2)) && (*local_10e8 == 0x53)) && (local_10e8[1] == 0x54)) {
    local_10e8 = local_10e8 + 2;
    local_10e0 = (undefined4)CONCAT71((int7)((ulong)local_10e8 >> 8),1);
  }
  else {
    local_10e0 = 0;
  }
  pbVar24 = (byte *)(end + -1);
  if ((local_10e8 < pbVar24) && (*local_10e8 == 0x43)) {
    local_10e8 = local_10e8 + 1;
    local_10d8 = (undefined4)CONCAT71((int7)((ulong)local_10e8 >> 8),1);
  }
  else {
    local_10d8 = 0;
  }
  if ((local_10e8 < pbVar24) && (*local_10e8 == 0x4e)) {
    local_10e8 = local_10e8 + 1;
    local_10d4 = (undefined4)CONCAT71((int7)((ulong)local_10e8 >> 8),1);
  }
  else {
    local_10d4 = 0;
  }
  if ((local_10e8 < pbVar24) && (*local_10e8 == 0x34)) {
    local_10e8 = local_10e8 + 1;
    local_10dc = (undefined4)CONCAT71((int7)((ulong)local_10e8 >> 8),1);
  }
  else {
    local_10dc = 0;
  }
  if ((local_10e8 < pbVar24) && (*local_10e8 == 0x6e)) {
    local_10e8 = local_10e8 + 1;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if ((((local_10e8 < (byte *)(end + -3)) && (*local_10e8 == 0x4f)) && (local_10e8[1] == 0x46)) &&
     (local_10e8[2] == 0x46)) {
    local_10e8 = local_10e8 + 3;
    NextToken((char **)&local_10e8,(char *)end);
  }
  else {
    NextToken((char **)&local_10e8,(char *)end);
    if ((pbVar24 <= local_10e8) || ((byte)(*local_10e8 - 0x3a) < 0xf6)) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1038 = &local_1028;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1038,"OFF: Header is invalid","");
      std::runtime_error::runtime_error(prVar18,(string *)&local_1038);
      *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
      __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_10dc = 0;
  }
  uVar23 = 3;
  if (bVar5) {
    bVar19 = *local_10e8;
    uVar23 = 0;
    if (0xf5 < (byte)(bVar19 - 0x3a)) {
      uVar23 = 0;
      do {
        uVar23 = (ulong)((uint)(byte)(bVar19 - 0x30) + (int)uVar23 * 10);
        bVar19 = local_10e8[1];
        local_10e8 = local_10e8 + 1;
      } while (0xf5 < (byte)(bVar19 - 0x3a));
    }
    NextToken((char **)&local_10e8,(char *)end);
  }
  local_10b0 = uVar23;
  if (3 < (uint)uVar23) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"OFF: Number of vertex coordinates higher than 3 unsupported",
               "");
    std::runtime_error::runtime_error(prVar18,(string *)&local_1038);
    *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  NextToken((char **)&local_10e8,(char *)end);
  uVar26 = 0;
  uVar23 = 0;
  bVar19 = *local_10e8;
  while (0xf5 < (byte)(bVar19 - 0x3a)) {
    uVar23 = (ulong)((uint)(byte)(bVar19 - 0x30) + (int)uVar23 * 10);
    pbVar24 = local_10e8 + 1;
    local_10e8 = local_10e8 + 1;
    bVar19 = *pbVar24;
  }
  NextToken((char **)&local_10e8,(char *)end);
  bVar19 = *local_10e8;
  if (0xf5 < (byte)(bVar19 - 0x3a)) {
    uVar26 = 0;
    do {
      uVar26 = (ulong)((uint)(byte)(bVar19 - 0x30) + (int)uVar26 * 10);
      bVar19 = local_10e8[1];
      local_10e8 = local_10e8 + 1;
    } while (0xf5 < (byte)(bVar19 - 0x3a));
  }
  NextToken((char **)&local_10e8,(char *)end);
  bVar19 = *local_10e8;
  while (0xf5 < (byte)(bVar19 - 0x3a)) {
    pbVar24 = local_10e8 + 1;
    local_10e8 = local_10e8 + 1;
    bVar19 = *pbVar24;
  }
  NextToken((char **)&local_10e8,(char *)end);
  if ((int)uVar23 == 0) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"OFF: There are no valid vertices","");
    std::runtime_error::runtime_error(prVar18,(string *)&local_1038);
    *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((uint)uVar26 == 0) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"OFF: There are no valid faces","");
    std::runtime_error::runtime_error(prVar18,(string *)&local_1038);
    *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pScene->mNumMeshes = 1;
  ppaVar8 = (aiMesh **)operator_new__(8);
  pScene->mMeshes = ppaVar8;
  local_10a8 = uVar23;
  local_1050 = pScene;
  paVar9 = (aiMesh *)operator_new(0x520);
  paVar9->mPrimitiveTypes = 0;
  paVar9->mNumVertices = 0;
  paVar9->mNumFaces = 0;
  local_1090 = &paVar9->mVertices;
  memset(local_1090,0,0xcc);
  paVar9->mBones = (aiBone **)0x0;
  paVar9->mMaterialIndex = 0;
  (paVar9->mName).length = 0;
  (paVar9->mName).data[0] = '\0';
  memset((paVar9->mName).data + 1,0x1b,0x3ff);
  paVar9->mNumAnimMeshes = 0;
  paVar9->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar9->mMethod = 0;
  (paVar9->mAABB).mMin.x = 0.0;
  (paVar9->mAABB).mMin.y = 0.0;
  (paVar9->mAABB).mMin.z = 0.0;
  (paVar9->mAABB).mMax.x = 0.0;
  (paVar9->mAABB).mMax.y = 0.0;
  (paVar9->mAABB).mMax.z = 0.0;
  paVar9->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar9->mNumUVComponents[0] = 0;
  paVar9->mNumUVComponents[1] = 0;
  paVar9->mNumUVComponents[2] = 0;
  paVar9->mNumUVComponents[3] = 0;
  paVar9->mNumUVComponents[4] = 0;
  paVar9->mNumUVComponents[5] = 0;
  paVar9->mNumUVComponents[6] = 0;
  paVar9->mNumUVComponents[7] = 0;
  paVar9->mColors[0] = (aiColor4D *)0x0;
  paVar9->mColors[1] = (aiColor4D *)0x0;
  paVar9->mColors[2] = (aiColor4D *)0x0;
  paVar9->mColors[3] = (aiColor4D *)0x0;
  paVar9->mColors[4] = (aiColor4D *)0x0;
  paVar9->mColors[5] = (aiColor4D *)0x0;
  paVar9->mColors[6] = (aiColor4D *)0x0;
  paVar9->mColors[7] = (aiColor4D *)0x0;
  *ppaVar8 = paVar9;
  paVar9->mNumFaces = (uint)uVar26;
  local_10c0 = paVar9;
  puVar10 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
  local_10a0 = local_10c0->mTextureCoords;
  local_1098 = local_10c0->mColors;
  *puVar10 = uVar26;
  paVar21 = (aiFace *)(puVar10 + 1);
  do {
    paVar21->mNumIndices = 0;
    paVar21->mIndices = (uint *)0x0;
    paVar21 = paVar21 + 1;
  } while (paVar21 != (aiFace *)(puVar10 + uVar26 * 2 + 1));
  local_10c0->mFaces = (aiFace *)(puVar10 + 1);
  uVar25 = (uint)local_10a8;
  local_10c0->mNumVertices = uVar25;
  uVar22 = local_10a8 & 0xffffffff;
  local_10d0 = uVar22 * 0xc;
  paVar11 = (aiVector3D *)operator_new__(local_10d0);
  uVar23 = uVar22 * 0xc - 0xc;
  paVar12 = (aiVector3D *)0x0;
  memset(paVar11,0,(uVar23 / 0xc) * 0xc + 0xc);
  *local_1090 = paVar11;
  if ((char)local_10d4 != '\0') {
    paVar12 = (aiVector3D *)operator_new__(local_10d0);
    memset(paVar12,0,(uVar23 / 0xc) * 0xc + 0xc);
  }
  local_10c0->mNormals = paVar12;
  if ((char)local_10d8 == '\0') {
    paVar13 = (aiColor4D *)0x0;
  }
  else {
    paVar13 = (aiColor4D *)operator_new__(uVar22 << 4);
    memset(paVar13,0,uVar22 << 4);
  }
  *local_1098 = paVar13;
  if ((char)local_10e0 != '\0') {
    local_10c0->mNumUVComponents[0] = 2;
    paVar11 = (aiVector3D *)operator_new__(local_10d0);
    memset(paVar11,0,(uVar23 / 0xc) * 0xc + 0xc);
    *local_10a0 = paVar11;
  }
  local_1048 = uVar26;
  local_1040 = (ulong)(uVar25 + (uVar25 == 0));
  uVar23 = local_10b0 & 0xffffffff;
  uVar26 = 0;
  pbVar24 = local_10e8;
  do {
    bVar19 = *pbVar24;
    if (bVar19 != 0) {
      for (uVar22 = 0;
          (bVar2 = pbVar24[uVar22], (bVar2 < 0xe & (byte)(0x3401 >> (bVar2 & 0x1f))) == 0 &&
          (uVar22 < 0x1000)); uVar22 = uVar22 + 1) {
        *(byte *)((long)&local_1038 + uVar22) = bVar2;
      }
      *(undefined1 *)((long)&local_1038 + uVar22) = 0;
      pbVar24 = pbVar24 + uVar22;
      while ((*pbVar24 < 0xe && ((0x3400U >> (*pbVar24 & 0x1f) & 1) != 0))) {
        pbVar24 = pbVar24 + 1;
      }
    }
    if (bVar19 == 0) {
      pLVar14 = DefaultLogger::get();
      Logger::error(pLVar14,"OFF: The number of verts in the header is incorrect");
      break;
    }
    paVar12 = *local_1090;
    local_10d0 = uVar26 * 3;
    local_1068 = paVar12 + uVar26;
    paVar11 = (aiVector3D *)&paVar12[uVar26].y;
    pfStack_1060 = (float *)paVar11;
    local_1058 = &paVar12[uVar26].z;
    pAVar28 = (Assimp *)&local_1038;
    if ((int)local_10b0 != 0) {
      uVar22 = 0;
      do {
        for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
        }
        pAVar28 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar28,(char *)(&local_1068)[uVar22],(float *)0x1,SUB81(paVar11,0));
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar23);
    }
    if ((char)local_10dc != '\0') {
      for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
      }
      local_10c4 = 1.0;
      pAVar28 = (Assimp *)
                fast_atoreal_move<float>(pAVar28,(char *)&local_10c4,(float *)0x1,SUB81(paVar11,0));
      if ((int)local_10b0 != 0) {
        uVar22 = 0;
        do {
          paVar11 = (&local_1068)[uVar22];
          paVar11->x = paVar11->x / local_10c4;
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
    }
    if ((char)local_10d4 != '\0') {
      for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
      }
      pfVar1 = &local_10c0->mNormals->x + local_10d0;
      pAVar28 = (Assimp *)
                fast_atoreal_move<float>(pAVar28,(char *)pfVar1,(float *)0x1,SUB81(local_10d0,0));
      while( true ) {
        AVar3 = *pAVar28;
        paVar11 = (aiVector3D *)(ulong)(byte)AVar3;
        if ((AVar3 != (Assimp)0x20) && (AVar3 != (Assimp)0x9)) break;
        pAVar28 = pAVar28 + 1;
      }
      for (pAVar28 = (Assimp *)
                     fast_atoreal_move<float>(pAVar28,(char *)(pfVar1 + 1),(float *)0x1,(bool)AVar3)
          ; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
      }
      fast_atoreal_move<float>(pAVar28,(char *)(pfVar1 + 2),(float *)0x1,SUB81(paVar11,0));
    }
    if ((char)local_10d8 != '\0') {
      for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
      }
      paVar13 = *local_1098 + uVar26;
      pAVar28 = (Assimp *)
                fast_atoreal_move<float>(pAVar28,(char *)paVar13,(float *)0x1,SUB81(paVar11,0));
      if (((ulong)(byte)*pAVar28 < 0x24) &&
         (paVar11 = (aiVector3D *)0x0, (0x800002400U >> ((ulong)(byte)*pAVar28 & 0x3f) & 1) != 0)) {
        paVar13->g = 0.0;
      }
      else {
        for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
        }
        pAVar28 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar28,(char *)&paVar13->g,(float *)0x1,SUB81(paVar11,0));
      }
      if (((ulong)(byte)*pAVar28 < 0x24) &&
         (paVar11 = (aiVector3D *)0x0, (0x800002400U >> ((ulong)(byte)*pAVar28 & 0x3f) & 1) != 0)) {
        paVar13->b = 0.0;
      }
      else {
        for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
        }
        pAVar28 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar28,(char *)&paVar13->b,(float *)0x1,SUB81(paVar11,0));
      }
      if (((ulong)(byte)*pAVar28 < 0x24) &&
         (paVar11 = (aiVector3D *)0x0, (0x800002400U >> ((ulong)(byte)*pAVar28 & 0x3f) & 1) != 0)) {
        paVar13->a = 1.0;
      }
      else {
        for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
        }
        pAVar28 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar28,(char *)&paVar13->a,(float *)0x1,SUB81(paVar11,0));
      }
    }
    if ((char)local_10e0 != '\0') {
      for (; (*pAVar28 == (Assimp)0x20 || (*pAVar28 == (Assimp)0x9)); pAVar28 = pAVar28 + 1) {
      }
      pfVar1 = &(*local_10a0)->x + local_10d0;
      for (pAVar28 = (Assimp *)
                     fast_atoreal_move<float>
                               (pAVar28,(char *)pfVar1,(float *)0x1,SUB81(local_10d0,0));
          (AVar3 = *pAVar28, AVar3 == (Assimp)0x20 || (AVar3 == (Assimp)0x9)); pAVar28 = pAVar28 + 1
          ) {
      }
      fast_atoreal_move<float>(pAVar28,(char *)(pfVar1 + 1),(float *)0x1,(bool)AVar3);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != local_1040);
  paVar21 = local_10c0->mFaces;
  iVar7 = (int)local_10a8;
  uVar23 = 0;
  do {
    bVar19 = *pbVar24;
    if (bVar19 != 0) {
      for (uVar26 = 0;
          (bVar2 = pbVar24[uVar26], (bVar2 < 0xe & (byte)(0x3401 >> (bVar2 & 0x1f))) == 0 &&
          (uVar26 < 0x1000)); uVar26 = uVar26 + 1) {
        *(byte *)((long)&local_1038 + uVar26) = bVar2;
      }
      *(undefined1 *)((long)&local_1038 + uVar26) = 0;
      pbVar24 = pbVar24 + uVar26;
      while ((*pbVar24 < 0xe && ((0x3400U >> (*pbVar24 & 0x1f) & 1) != 0))) {
        pbVar24 = pbVar24 + 1;
      }
    }
    if (bVar19 == 0) {
      pLVar14 = DefaultLogger::get();
      Logger::error(pLVar14,"OFF: The number of faces in the header is incorrect");
      break;
    }
    for (pplVar27 = &local_1038; (cVar4 = *(char *)pplVar27, cVar4 == ' ' || (cVar4 == '\t'));
        pplVar27 = (long **)((long)pplVar27 + 1)) {
    }
    uVar25 = 0;
    if (0xf5 < (byte)(cVar4 - 0x3aU)) {
      uVar25 = 0;
      do {
        uVar25 = (uint)(byte)(cVar4 - 0x30) + uVar25 * 10;
        cVar4 = *(char *)((long)pplVar27 + 1);
        pplVar27 = (long **)((long)pplVar27 + 1);
      } while (0xf5 < (byte)(cVar4 - 0x3aU));
    }
    if (uVar25 - 10 < 0xfffffff7) {
      pLVar14 = DefaultLogger::get();
      Logger::error(pLVar14,"OFF: Faces with zero indices aren\'t allowed");
      local_10c0->mNumFaces = local_10c0->mNumFaces - 1;
    }
    else {
      paVar21->mNumIndices = uVar25;
      puVar15 = (uint *)operator_new__((ulong)(uVar25 << 2));
      paVar21->mIndices = puVar15;
      local_10d0 = uVar23;
      if (paVar21->mNumIndices != 0) {
        uVar23 = 0;
        do {
          for (; (cVar4 = *(char *)pplVar27, cVar4 == ' ' || (cVar4 == '\t'));
              pplVar27 = (long **)((long)pplVar27 + 1)) {
          }
          uVar25 = 0;
          if (0xf5 < (byte)(cVar4 - 0x3aU)) {
            uVar25 = 0;
            do {
              uVar25 = (uint)(byte)(cVar4 - 0x30) + uVar25 * 10;
              cVar4 = *(char *)((long)pplVar27 + 1);
              pplVar27 = (long **)((long)pplVar27 + 1);
            } while (0xf5 < (byte)(cVar4 - 0x3aU));
          }
          if ((uint)local_10a8 <= uVar25) {
            pLVar14 = DefaultLogger::get();
            Logger::error(pLVar14,"OFF: Vertex index is out of range");
            uVar25 = iVar7 - 1;
          }
          paVar21->mIndices[uVar23] = uVar25;
          uVar23 = uVar23 + 1;
        } while (uVar23 < paVar21->mNumIndices);
      }
      uVar23 = (ulong)((int)local_10d0 + 1);
      paVar21 = paVar21 + 1;
    }
  } while ((uint)uVar23 < (uint)local_1048);
  this_00 = (aiNode *)operator_new(0x478);
  paVar6 = local_1050;
  aiNode::aiNode(this_00);
  paVar6->mRootNode = this_00;
  (this_00->mName).length = 9;
  builtin_strncpy((this_00->mName).data,"<OFFRoot>",10);
  this_00->mNumMeshes = 1;
  puVar15 = (uint *)operator_new__(4);
  this_00->mMeshes = puVar15;
  *puVar15 = 0;
  paVar6->mNumMaterials = 1;
  ppaVar16 = (aiMaterial **)operator_new__(8);
  paVar6->mMaterials = ppaVar16;
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  local_1068 = (aiVector3D *)0x3f19999a3f19999a;
  pfStack_1060 = (float *)0x3f8000003f19999a;
  aiMaterial::AddBinaryProperty(this_01,&local_1068,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  *paVar6->mMaterials = this_01;
  local_10c4 = 1.4013e-45;
  aiMaterial::AddBinaryProperty(this_01,&local_10c4,4,"$mat.twosided",0,0,aiPTI_Integer);
  if ((byte *)local_1088._M_dataplus._M_p != (byte *)0x0) {
    operator_delete(local_1088._M_dataplus._M_p,
                    local_1088.field_2._M_allocated_capacity - (long)local_1088._M_dataplus._M_p);
  }
  (*local_10b8->_vptr_IOStream[1])();
  return;
}

Assistant:

void OFFImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open OFF file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // Proper OFF header parser. We only implement normal loading for now.
    bool hasTexCoord = false, hasNormals = false, hasColors = false;
    bool hasHomogenous = false, hasDimension = false;
    unsigned int dimensions = 3;
    const char* car = buffer;
    const char* end = buffer + mBuffer2.size();
    NextToken(&car, end);
    
    if (car < end - 2 && car[0] == 'S' && car[1] == 'T') {
      hasTexCoord = true; car += 2;
    }
    if (car < end - 1 && car[0] == 'C') {
      hasColors = true; car++;
    }
    if (car < end- 1 && car[0] == 'N') {
      hasNormals = true; car++;
    }
    if (car < end - 1 && car[0] == '4') {
      hasHomogenous = true; car++;
    }
    if (car < end - 1 && car[0] == 'n') {
      hasDimension = true; car++;
    }
    if (car < end - 3 && car[0] == 'O' && car[1] == 'F' && car[2] == 'F') {
        car += 3;
	NextToken(&car, end);
    } else {
      // in case there is no OFF header (which is allowed by the
      // specification...), then we might have unintentionally read an
      // additional dimension from the primitive count fields
      dimensions = 3;
      hasHomogenous = false;
      NextToken(&car, end);
      
      // at this point the next token should be an integer number
      if (car >= end - 1 || *car < '0' || *car > '9') {
	throw DeadlyImportError("OFF: Header is invalid");
      }
    }
    if (hasDimension) {
        dimensions = strtoul10(car, &car);
	NextToken(&car, end);
    }
    if (dimensions > 3) {
        throw DeadlyImportError
	  ("OFF: Number of vertex coordinates higher than 3 unsupported");
    }

    NextToken(&car, end);
    const unsigned int numVertices = strtoul10(car, &car);
    NextToken(&car, end);
    const unsigned int numFaces = strtoul10(car, &car);
    NextToken(&car, end);
    strtoul10(car, &car);  // skip edge count
    NextToken(&car, end);

    if (!numVertices) {
        throw DeadlyImportError("OFF: There are no valid vertices");
    }
    if (!numFaces) {
        throw DeadlyImportError("OFF: There are no valid faces");
    }

    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];

    aiMesh* mesh = new aiMesh();
    pScene->mMeshes[0] = mesh;

    mesh->mNumFaces = numFaces;
    aiFace* faces = new aiFace[mesh->mNumFaces];
    mesh->mFaces = faces;

    mesh->mNumVertices = numVertices;
    mesh->mVertices = new aiVector3D[numVertices];
    mesh->mNormals = hasNormals ? new aiVector3D[numVertices] : nullptr;
    mesh->mColors[0] = hasColors ? new aiColor4D[numVertices] : nullptr;

    if (hasTexCoord) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[numVertices];
    }
    char line[4096];
    buffer = car;
    const char *sz = car;

    // now read all vertex lines
    for (unsigned int i = 0; i < numVertices; ++i) {
        if(!GetNextLine(buffer, line)) {
            ASSIMP_LOG_ERROR("OFF: The number of verts in the header is incorrect");
            break;
        }
        aiVector3D& v = mesh->mVertices[i];	
        sz = line;

	// helper array to write a for loop over possible dimension values
	ai_real* vec[3] = {&v.x, &v.y, &v.z};

	// stop at dimensions: this allows loading 1D or 2D coordinate vertices
        for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz, *vec[dim]);
	}

	// if has homogenous coordinate, divide others by this one
	if (hasHomogenous) {
	    SkipSpaces(&sz);
	    ai_real w = 1.;
	    sz = fast_atoreal_move<ai_real>(sz, w);
            for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	        *(vec[dim]) /= w;
	    }
	}

	// read optional normals
	if (hasNormals) {
	    aiVector3D& n = mesh->mNormals[i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.x);
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.y);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)n.z);
	}
	
	// reading colors is a pain because the specification says it can be
	// integers or floats, and any number of them between 1 and 4 included,
	// until the next comment or end of line
	// in theory should be testing type !
	if (hasColors) {
	    aiColor4D& c = mesh->mColors[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.r);
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.g);
            } else {
	        c.g = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.b);
            } else {
	        c.b = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.a);
            } else {
	        c.a = 1.;
	    }
	}
        if (hasTexCoord) {
	    aiVector3D& t = mesh->mTextureCoords[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)t.x);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)t.y);
	}
    }

    // load faces with their indices
    faces = mesh->mFaces;
    for (unsigned int i = 0; i < numFaces; ) {
        if(!GetNextLine(buffer,line)) {
            ASSIMP_LOG_ERROR("OFF: The number of faces in the header is incorrect");
            break;
        }
        unsigned int idx;
        sz = line; SkipSpaces(&sz);
        idx = strtoul10(sz,&sz);
        if(!idx || idx > 9) {
	    ASSIMP_LOG_ERROR("OFF: Faces with zero indices aren't allowed");
            --mesh->mNumFaces;
            continue;
	}
	faces->mNumIndices = idx;
        faces->mIndices = new unsigned int[faces->mNumIndices];
        for (unsigned int m = 0; m < faces->mNumIndices;++m) {
            SkipSpaces(&sz);
            idx = strtoul10(sz,&sz);
            if (idx >= numVertices) {
                ASSIMP_LOG_ERROR("OFF: Vertex index is out of range");
                idx = numVertices - 1;
            }
            faces->mIndices[m] = idx;
        }
        ++i;
        ++faces;
    }
    
    // generate the output node graph
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<OFFRoot>");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int [pScene->mRootNode->mNumMeshes];
    pScene->mRootNode->mMeshes[0] = 0;

    // generate a default material
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    aiMaterial* pcMat = new aiMaterial();

    aiColor4D clr( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 1.0 ) );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
    pScene->mMaterials[0] = pcMat;

    const int twosided = 1;
    pcMat->AddProperty(&twosided, 1, AI_MATKEY_TWOSIDED);
}